

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::ipv4_peer::ipv4_peer(ipv4_peer *this,endpoint *ep,bool c,peer_source_flags_t src)

{
  undefined1 *puVar1;
  ushort uVar2;
  
  uVar2 = (ep->impl_).data_.v4.sin_port;
  torrent_peer::torrent_peer(&this->super_torrent_peer,uVar2 << 8 | uVar2 >> 8,c,src);
  boost::asio::ip::address::to_v4((address *)&this->addr);
  puVar1 = &(this->super_torrent_peer).field_0x1e;
  *puVar1 = *puVar1 & 0xfc;
  return;
}

Assistant:

ipv4_peer::ipv4_peer(tcp::endpoint const& ep, bool c
		, peer_source_flags_t const src)
		: torrent_peer(ep.port(), c, src)
		, addr(ep.address().to_v4())
	{
		is_v6_addr = false;
#if TORRENT_USE_I2P
		is_i2p_addr = false;
#endif
#if TORRENT_USE_RTC
		is_rtc_addr = false;
#endif
	}